

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
* __thiscall
QFlatMap<QPushButton*,QDialogButtonBox::StandardButton,std::less<QPushButton*>,QVarLengthArray<QPushButton*,8ll>,QVarLengthArray<QDialogButtonBox::StandardButton,8ll>>
::try_emplace<QDialogButtonBox::StandardButton_const&>
          (QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
           *this,QPushButton **key,StandardButton *args)

{
  iterator it_00;
  iterator it_01;
  bool bVar1;
  QPushButton **ppQVar2;
  containers *before;
  undefined8 *in_RDX;
  less<QPushButton_*> *in_RSI;
  pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
  *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  QVarLengthArray<QPushButton_*,_8LL> *in_stack_ffffffffffffff60;
  pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
  *kit;
  bool local_79;
  bool local_5a;
  bool local_59;
  containers *local_58;
  size_type local_50;
  iterator local_48;
  containers *local_38;
  size_type local_30;
  iterator local_28;
  iterator local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.i = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_18.c = (containers *)&DAT_aaaaaaaaaaaaaaaa;
  kit = in_RDI;
  local_18 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
             ::lower_bound((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                            *)in_RSI,(QPushButton **)in_RDI);
  local_28 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
             ::end((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                    *)in_RDI);
  bVar1 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
          ::iterator::operator==(&local_18,&local_28);
  local_79 = true;
  if (!bVar1) {
    in_stack_ffffffffffffff60 = (QVarLengthArray<QPushButton_*,_8LL> *)*in_RDX;
    ppQVar2 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
              ::iterator::key((iterator *)0x67209d);
    local_79 = std::less<QPushButton_*>::operator()
                         (in_RSI,(QPushButton *)in_stack_ffffffffffffff60,*ppQVar2);
  }
  if (local_79 == false) {
    local_5a = false;
    std::
    pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
    ::
    pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator_&,_bool,_true>
              (in_RDI,&local_18,&local_5a);
  }
  else {
    before = (containers *)(in_RSI + 0x58);
    local_38 = local_18.c;
    local_30 = local_18.i;
    it_00.i = (size_type)in_stack_ffffffffffffff60;
    it_00.c = before;
    QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
    ::toValuesIterator((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                        *)0x6720f9,it_00);
    QVarLengthArray<QDialogButtonBox::StandardButton,8ll>::
    emplace<QDialogButtonBox::StandardButton_const&>
              ((QVarLengthArray<QDialogButtonBox::StandardButton,_8LL> *)in_stack_ffffffffffffff60,
               (const_iterator)before,(StandardButton *)0x67210a);
    local_58 = local_18.c;
    local_50 = local_18.i;
    it_01.i = (size_type)in_stack_ffffffffffffff60;
    it_01.c = before;
    QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
    ::toKeysIterator((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                      *)0x672138,it_01);
    QVarLengthArray<QPushButton_*,_8LL>::insert
              (in_stack_ffffffffffffff60,(const_iterator)before,(QPushButton **)0x67214a);
    local_48 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
               ::fromKeysIterator((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                                   *)in_RSI,(iterator)kit);
    local_59 = true;
    std::
    pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
    ::
    pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool,_true>
              (in_RDI,&local_48,&local_59);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return kit;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }